

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

secp256k1_aggsig_context *
secp256k1_aggsig_context_create
          (secp256k1_context *ctx,secp256k1_pubkey *pubkeys,size_t n_pubkeys,uchar *seed)

{
  nonce_progress *pnVar1;
  secp256k1_pubkey *psVar2;
  secp256k1_scalar *psVar3;
  long in_RCX;
  size_t in_RDX;
  void *in_RSI;
  secp256k1_aggsig_context *aggctx;
  size_t in_stack_00000090;
  uchar *in_stack_00000098;
  secp256k1_rfc6979_hmac_sha256 *in_stack_000000a0;
  char *in_stack_ffffffffffffffc8;
  secp256k1_callback *in_stack_ffffffffffffffd0;
  secp256k1_aggsig_context *local_8;
  
  if (in_RSI == (void *)0x0) {
    secp256k1_callback_call(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    local_8 = (secp256k1_aggsig_context *)0x0;
  }
  else if (in_RCX == 0) {
    secp256k1_callback_call(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    local_8 = (secp256k1_aggsig_context *)0x0;
  }
  else {
    local_8 = (secp256k1_aggsig_context *)
              checked_malloc(in_stack_ffffffffffffffd0,(size_t)in_stack_ffffffffffffffc8);
    pnVar1 = (nonce_progress *)
             checked_malloc((secp256k1_callback *)local_8,(size_t)in_stack_ffffffffffffffc8);
    local_8->progress = pnVar1;
    psVar2 = (secp256k1_pubkey *)
             checked_malloc((secp256k1_callback *)local_8,(size_t)in_stack_ffffffffffffffc8);
    local_8->pubkeys = psVar2;
    psVar3 = (secp256k1_scalar *)
             checked_malloc((secp256k1_callback *)local_8,(size_t)in_stack_ffffffffffffffc8);
    local_8->secnonce = psVar3;
    local_8->n_sigs = in_RDX;
    secp256k1_gej_set_infinity((secp256k1_gej *)0x115ca7);
    memcpy(local_8->pubkeys,in_RSI,in_RDX << 6);
    memset(local_8->progress,0,in_RDX << 2);
    secp256k1_rfc6979_hmac_sha256_initialize(in_stack_000000a0,in_stack_00000098,in_stack_00000090);
  }
  return local_8;
}

Assistant:

secp256k1_aggsig_context* secp256k1_aggsig_context_create(const secp256k1_context *ctx, const secp256k1_pubkey *pubkeys, size_t n_pubkeys, const unsigned char *seed) {
    secp256k1_aggsig_context* aggctx;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkeys != NULL);
    ARG_CHECK(seed != NULL);

    aggctx = (secp256k1_aggsig_context*)checked_malloc(&ctx->error_callback, sizeof(*aggctx));
    aggctx->progress = (enum nonce_progress*)checked_malloc(&ctx->error_callback, n_pubkeys * sizeof(*aggctx->progress));
    aggctx->pubkeys = (secp256k1_pubkey*)checked_malloc(&ctx->error_callback, n_pubkeys * sizeof(*aggctx->pubkeys));
    aggctx->secnonce = (secp256k1_scalar*)checked_malloc(&ctx->error_callback, n_pubkeys * sizeof(*aggctx->secnonce));
    aggctx->n_sigs = n_pubkeys;
    secp256k1_gej_set_infinity(&aggctx->pubnonce_sum);
    memcpy(aggctx->pubkeys, pubkeys, n_pubkeys * sizeof(*aggctx->pubkeys));
    memset(aggctx->progress, 0, n_pubkeys * sizeof(*aggctx->progress));
    secp256k1_rfc6979_hmac_sha256_initialize(&aggctx->rng, seed, 32);
    return aggctx;
}